

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::fboc::details::AttachmentTest::build(AttachmentTest *this,FboBuilder *builder)

{
  Context *pCVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  GLenum target;
  GLint maxAttachments;
  int local_1c;
  
  TestBase::attachTargetToNew
            ((TestBase *)this,0x8ce0,
             (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.color0Kind
             ,(ImageFormat)0x0,0x40,0x40,builder);
  if ((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.colornKind != 0)
  {
    pCVar1 = (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).super_TestBase.
             m_ctx;
    if (pCVar1->m_haveMultiColorAtts == false) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Multiple attachments not supported","m_ctx.haveMultiColorAtts()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                 ,0x38f);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1c = 1;
    iVar2 = (*pCVar1->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0x8cdf,&local_1c);
    iVar2 = (*((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).super_TestBase.
              m_ctx)->m_renderCtx->_vptr_RenderContext[3])();
    err = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    glu::checkError(err,"Couldn\'t read GL_MAX_COLOR_ATTACHMENTS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                    ,0x393);
    if (1 < local_1c) {
      target = 0x8ce1;
      do {
        TestBase::attachTargetToNew
                  ((TestBase *)this,target,
                   (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.
                   colornKind,(ImageFormat)0x0,0x40,0x40,builder);
        iVar2 = target - 0x8cdf;
        target = target + 1;
      } while (iVar2 < local_1c);
    }
  }
  makeDepthAndStencil(this,builder);
  return STOP;
}

Assistant:

IterateResult AttachmentTest::build (FboBuilder& builder)
{
	attachTargetToNew(GL_COLOR_ATTACHMENT0, m_params.color0Kind, ImageFormat::none(),
					  64, 64, builder);

	if (m_params.colornKind != GL_NONE)
	{
		TCU_CHECK_AND_THROW(NotSupportedError, m_ctx.haveMultiColorAtts(),
							"Multiple attachments not supported");
		GLint maxAttachments = 1;
		gl(*this).getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &maxAttachments);
		GLU_EXPECT_NO_ERROR(
			gl(*this).getError(), "Couldn't read GL_MAX_COLOR_ATTACHMENTS");

		for (int i = 1; i < maxAttachments; i++)
		{
			attachTargetToNew(GL_COLOR_ATTACHMENT0 + i, m_params.colornKind,
							  ImageFormat::none(), 64, 64, builder);
		}
	}

	makeDepthAndStencil(builder);

	return STOP;
}